

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

void __thiscall
Scine::Core::ModuleManager::Impl::load(Impl *this,shared_ptr<Scine::Core::Module> *module)

{
  undefined1 uVar1;
  iterator __first;
  __normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  in_RDI;
  ModulePtr *in_stack_00000008;
  LibraryAndModules *in_stack_00000010;
  bool alreadyLoaded;
  LibraryAndModules lib;
  shared_ptr<Scine::Core::Module> *in_stack_ffffffffffffff78;
  value_type *__x;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  anon_class_8_1_8991fb9c_for__M_pred __pred;
  Impl local_40;
  value_type local_28;
  
  __pred.this = &local_40;
  std::shared_ptr<Scine::Core::Module>::shared_ptr
            ((shared_ptr<Scine::Core::Module> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  LibraryAndModules::LibraryAndModules(in_stack_00000010,in_stack_00000008);
  std::shared_ptr<Scine::Core::Module>::~shared_ptr((shared_ptr<Scine::Core::Module> *)0x12862b);
  __x = &local_28;
  std::
  begin<std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>
            ((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
              *)__x);
  __first = std::
            end<std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>
                      ((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                        *)__x);
  uVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,Scine::Core::ModuleManager::Impl::load(std::shared_ptr<Scine::Core::Module>)::_lambda(auto:1_const&)_1_>
                    ((__normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                      )__first._M_current,in_RDI,__pred);
  if (!(bool)uVar1) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::push_back((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                 *)CONCAT17(uVar1,in_stack_ffffffffffffff80),__x);
  }
  LibraryAndModules::~LibraryAndModules
            ((LibraryAndModules *)CONCAT17(uVar1,in_stack_ffffffffffffff80));
  return;
}

Assistant:

void load(std::shared_ptr<Module> module) {
    LibraryAndModules lib{module};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }